

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::bne(Code *this,string *label)

{
  mapped_type *this_00;
  key_type_conflict3 local_14;
  
  add_word(this,0x6600);
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_pending_branches,&local_14);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,label);
  resolve_branches(this);
  return this;
}

Assistant:

Code& Code::bne(const std::string& label)
{
    this->add_opcode(0x6600);
    _pending_branches[static_cast<uint32_t>(_bytes.size())] = label;
    this->resolve_branches();
    return *this;
}